

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BplusTree.hpp
# Opt level: O0

void __thiscall
sjtu::BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::BplusTree
          (BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this,
          string *str,uint cache_size)

{
  string *in_RSI;
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *in_RDI;
  string local_38 [56];
  
  std::__cxx11::string::string(local_38,in_RSI);
  init(in_RDI,(EVP_PKEY_CTX *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

BplusTree(std::string str , unsigned int cache_size) {
            init(str , cache_size);
        }